

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O0

int h264_ref_idx(bitstream *str,h264_cabac_context *cabac,int idx,int which,int max,uint32_t *val)

{
  int iVar1;
  int iVar2;
  uint32_t in_ECX;
  int in_EDX;
  int *in_RSI;
  h264_cabac_context *in_RDI;
  int in_R8D;
  int *in_R9;
  int ctxIdx [3];
  int condTermFlagB;
  int condTermFlagA;
  int thrB;
  int thrA;
  h264_macroblock *mbB;
  h264_macroblock *mbA;
  h264_macroblock *mbT;
  int idxB;
  int idxA;
  uint32_t tmp;
  uint32_t in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  h264_mb_pos in_stack_ffffffffffffffa4;
  h264_slice *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_R8D == 0) {
    iVar1 = vs_infer((bitstream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (uint32_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c);
  }
  else if (in_RSI == (int *)0x0) {
    if (in_R8D == 1) {
      iVar1 = 1 - *in_R9;
      iVar2 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (uint32_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c);
      if (iVar2 == 0) {
        *in_R9 = 1 - iVar1;
        iVar1 = 0;
      }
      else {
        iVar1 = 1;
      }
    }
    else {
      iVar1 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    (uint32_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
  }
  else {
    h264_mb_nb(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
    h264_mb_nb_b((h264_slice *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                 (h264_mb_pos)((ulong)in_R9 >> 0x20),(h264_block_size)in_R9,
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                 (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    h264_mb_nb_b((h264_slice *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                 (h264_mb_pos)((ulong)in_R9 >> 0x20),(h264_block_size)in_R9,
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                 (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar1 = h264_cabac_tu((bitstream *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                          ,in_RDI,in_RSI,in_EDX,in_ECX,
                          (uint32_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8));
  }
  return iVar1;
}

Assistant:

int h264_ref_idx(struct bitstream *str, struct h264_cabac_context *cabac, int idx, int which, int max, uint32_t *val) {
	if (!max)
		return vs_infer(str, val, 0);
	if (!cabac) {
		if (max == 1) {
			uint32_t tmp = 1 - *val;
			if (vs_u(str, val, 1)) return 1;
			*val = 1 - tmp;
			return 0;
		} else {
			return vs_ue(str, val);
		}
	}
	int idxA, idxB;
	const struct h264_macroblock *mbT = h264_mb_nb(cabac->slice, H264_MB_THIS, 0);
	const struct h264_macroblock *mbA = h264_mb_nb_b(cabac->slice, H264_MB_A, H264_BLOCK_8X8, 0, idx, &idxA);
	const struct h264_macroblock *mbB = h264_mb_nb_b(cabac->slice, H264_MB_B, H264_BLOCK_8X8, 0, idx, &idxB);
	int thrA, thrB;
	thrA = (!mbT->mb_field_decoding_flag && mbA->mb_field_decoding_flag);
	thrB = (!mbT->mb_field_decoding_flag && mbB->mb_field_decoding_flag);
	int condTermFlagA = mbA->ref_idx[which][idxA] > thrA;
	int condTermFlagB = mbB->ref_idx[which][idxB] > thrB;
	int ctxIdx[3];
	ctxIdx[0] = H264_CABAC_CTXIDX_REF_IDX + condTermFlagA + 2 * condTermFlagB;
	ctxIdx[1] = H264_CABAC_CTXIDX_REF_IDX + 4;
	ctxIdx[2] = H264_CABAC_CTXIDX_REF_IDX + 5;
	return h264_cabac_tu(str, cabac, ctxIdx, 3, -1, val);
}